

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O0

void __thiscall iqxmlrpc::Parser::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  xmlFreeTextReader(this->reader);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Impl()
  {
    xmlFreeTextReader(reader);
  }